

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

void __thiscall Assimp::ColladaParser::ReadMaterial(ColladaParser *this,Material *pMaterial)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  allocator<char> local_49;
  string local_48;
  
  do {
    while( true ) {
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
      if ((char)iVar2 == '\0') {
        return;
      }
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar2 == 1) break;
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar2 == 2) {
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar2 = strcmp((char *)CONCAT44(extraout_var_00,iVar2),"material");
        if (iVar2 == 0) {
          return;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_48,"Expected end of <material> element.",&local_49);
        ThrowException(this,&local_48);
      }
    }
    bVar1 = IsElement(this,"material");
    if ((!bVar1) && (bVar1 = IsElement(this,"instance_effect"), bVar1)) {
      uVar3 = GetAttribute(this,"url");
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar3);
      if (*(char *)CONCAT44(extraout_var,iVar2) != '#') {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_48,"Unknown reference format",&local_49);
        ThrowException(this,&local_48);
      }
      std::__cxx11::string::assign((char *)&pMaterial->mEffect);
    }
    SkipElement(this);
  } while( true );
}

Assistant:

void ColladaParser::ReadMaterial(Collada::Material& pMaterial)
{
    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT) {
            if (IsElement("material")) {
                SkipElement();
            }
            else if (IsElement("instance_effect"))
            {
                // referred effect by URL
                int attrUrl = GetAttribute("url");
                const char* url = mReader->getAttributeValue(attrUrl);
                if (url[0] != '#')
                    ThrowException("Unknown reference format");

                pMaterial.mEffect = url + 1;

                SkipElement();
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END) {
            if (strcmp(mReader->getNodeName(), "material") != 0)
                ThrowException("Expected end of <material> element.");

            break;
        }
    }
}